

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-extra.cc
# Opt level: O0

void __thiscall OutputRedirect::OutputRedirect(OutputRedirect *this,FILE *file)

{
  int __fd2;
  FILE *in_RSI;
  File *in_RDI;
  File write_end;
  int fd;
  File *in_stack_ffffffffffffffb8;
  File *pFVar1;
  File local_28;
  File local_24;
  int local_20;
  
  *(FILE **)in_RDI = in_RSI;
  pFVar1 = in_RDI + 2;
  fmt::File::File(pFVar1);
  fmt::File::File(in_RDI + 3);
  flush((OutputRedirect *)in_RSI);
  local_20 = fileno(in_RSI);
  fmt::File::dup(&local_24,local_20);
  fmt::File::operator=(pFVar1,in_stack_ffffffffffffffb8);
  fmt::File::~File(in_RDI);
  pFVar1 = &local_28;
  fmt::File::File(pFVar1);
  fmt::File::pipe(in_RDI + 3,&pFVar1->fd_);
  fmt::File::dup2(&local_28,local_20,__fd2);
  fmt::File::~File(in_RDI);
  return;
}

Assistant:

OutputRedirect::OutputRedirect(FILE *file) : file_(file) {
  flush();
  int fd = FMT_POSIX(fileno(file));
  // Create a File object referring to the original file.
  original_ = File::dup(fd);
  // Create a pipe.
  File write_end;
  File::pipe(read_end_, write_end);
  // Connect the passed FILE object to the write end of the pipe.
  write_end.dup2(fd);
}